

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall var_iter_demote_Test::~var_iter_demote_Test(var_iter_demote_Test *this)

{
  var_iter_demote_Test *this_local;
  
  ~var_iter_demote_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(var, iter_demote) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 5);
    auto iter1 = std::make_shared<IterVar>(&mod, "iter1", 0, 4);
    auto iter2 = std::make_shared<IterVar>(&mod, "iter1", 0, 42);
    EXPECT_NO_THROW(a.assign(iter1));
    EXPECT_THROW(a.assign(iter2), VarException);
}